

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O2

void __thiscall uttt::IBoard::MirrorVertical(IBoard *this)

{
  short sVar1;
  short sVar2;
  short sVar3;
  long lVar4;
  undefined1 auVar5 [16];
  
  this->macro = g_macro_mirrored_vertical[this->macro];
  for (lVar4 = 4; lVar4 != 0x16; lVar4 = lVar4 + 2) {
    *(short *)((long)(this->micro)._M_elems + lVar4 + -4) =
         (short)g_mirrored_vertical[*(short *)((long)(this->micro)._M_elems + lVar4 + -4)];
  }
  sVar1 = (this->micro)._M_elems[0];
  sVar2 = (this->micro)._M_elems[3];
  sVar3 = (this->micro)._M_elems[6];
  auVar5 = ZEXT416(*(uint *)((this->micro)._M_elems + 1));
  auVar5 = pshuflw(auVar5,auVar5,0xe1);
  *(int *)(this->micro)._M_elems = auVar5._0_4_;
  (this->micro)._M_elems[2] = sVar1;
  auVar5 = ZEXT416(*(uint *)((this->micro)._M_elems + 4));
  auVar5 = pshuflw(auVar5,auVar5,0xe1);
  *(int *)((this->micro)._M_elems + 3) = auVar5._0_4_;
  (this->micro)._M_elems[5] = sVar2;
  auVar5 = ZEXT416(*(uint *)((this->micro)._M_elems + 7));
  auVar5 = pshuflw(auVar5,auVar5,0xe1);
  *(int *)((this->micro)._M_elems + 6) = auVar5._0_4_;
  (this->micro)._M_elems[8] = sVar3;
  if ((long)this->next != -1) {
    this->next = "\x02\x01"[this->next];
  }
  return;
}

Assistant:

void
IBoard::MirrorVertical()
{
    macro = g_macro_mirrored_vertical[macro];
    for (auto &m : micro)
        m = g_mirrored_vertical[m];
    micro = {{micro[2], micro[1], micro[0], micro[5], micro[4], micro[3], micro[8], micro[7], micro[6]}};
    if (next != -1)
        next = g_next_mirrored_vertical[next];
}